

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O0

bool readEtcFile(QUnixOSVersion *v,char *filename,QByteArray *idKey,QByteArray *versionKey,
                QByteArray *prettyNameKey)

{
  long lVar1;
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  QByteArrayView str;
  QByteArrayView str_00;
  QByteArrayView str_01;
  bool bVar2;
  char *__s;
  const_iterator pcVar3;
  QByteArrayView *this;
  QByteArray *in_RCX;
  QByteArray *in_RDX;
  storage_type *in_RSI;
  QByteArray *in_R8;
  long in_FS_OFFSET;
  char *eol;
  char *end;
  char *ptr;
  QByteArray line;
  QByteArray buffer;
  QString *in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec1;
  undefined1 in_stack_fffffffffffffec2;
  undefined1 in_stack_fffffffffffffec3;
  undefined4 in_stack_fffffffffffffec4;
  QByteArray *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  bool local_e1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  getEtcFileContent((char *)in_RDX);
  bVar2 = QByteArray::isEmpty((QByteArray *)0x25c51d);
  if (bVar2) {
    local_e1 = false;
  }
  else {
    __s = QByteArray::constData((QByteArray *)0x25c542);
    pcVar3 = QByteArray::constEnd((QByteArray *)0x25c554);
    QByteArray::QByteArray((QByteArray *)0x25c5a2);
    while (__s != pcVar3) {
      this = (QByteArrayView *)memchr(__s,10,(long)pcVar3 - (long)__s);
      if (this == (QByteArrayView *)0x0) {
        this = (QByteArrayView *)(pcVar3 + -1);
      }
      QByteArray::setRawData
                ((QByteArray *)this,(char *)in_stack_fffffffffffffec8,
                 CONCAT44(in_stack_fffffffffffffec4,
                          CONCAT13(in_stack_fffffffffffffec3,
                                   CONCAT12(in_stack_fffffffffffffec2,
                                            CONCAT11(in_stack_fffffffffffffec1,
                                                     in_stack_fffffffffffffec0)))));
      QByteArrayView::QByteArrayView<QByteArray,_true>(this,in_stack_fffffffffffffec8);
      bv.m_data._0_4_ = in_stack_fffffffffffffee8;
      bv.m_size = (qsizetype)__s;
      bv.m_data._4_4_ = in_stack_fffffffffffffeec;
      in_stack_fffffffffffffec3 = QByteArray::startsWith(in_stack_fffffffffffffec8,bv);
      if ((bool)in_stack_fffffffffffffec3) {
        QByteArray::size(in_RDX);
        QByteArrayView::QByteArrayView<char,_true>
                  ((QByteArrayView *)
                   CONCAT44(in_stack_fffffffffffffec4,
                            CONCAT13(in_stack_fffffffffffffec3,
                                     CONCAT12(in_stack_fffffffffffffec2,
                                              CONCAT11(in_stack_fffffffffffffec1,
                                                       in_stack_fffffffffffffec0)))),
                   (char *)in_stack_fffffffffffffeb8,(char *)0x25c678);
        str.m_data = in_RSI;
        str.m_size = (qsizetype)in_RDX;
        unquote(str);
        QString::operator=((QString *)
                           CONCAT44(in_stack_fffffffffffffec4,
                                    CONCAT13(in_stack_fffffffffffffec3,
                                             CONCAT12(in_stack_fffffffffffffec2,
                                                      CONCAT11(in_stack_fffffffffffffec1,
                                                               in_stack_fffffffffffffec0)))),
                           in_stack_fffffffffffffeb8);
        QString::~QString((QString *)0x25c6b8);
      }
      else {
        QByteArrayView::QByteArrayView<QByteArray,_true>(this,in_stack_fffffffffffffec8);
        bv_00.m_data._0_4_ = in_stack_fffffffffffffee8;
        bv_00.m_size = (qsizetype)__s;
        bv_00.m_data._4_4_ = in_stack_fffffffffffffeec;
        in_stack_fffffffffffffec2 = QByteArray::startsWith(in_stack_fffffffffffffec8,bv_00);
        if ((bool)in_stack_fffffffffffffec2) {
          QByteArray::size(in_R8);
          QByteArrayView::QByteArrayView<char,_true>
                    ((QByteArrayView *)
                     CONCAT44(in_stack_fffffffffffffec4,
                              CONCAT13(in_stack_fffffffffffffec3,
                                       CONCAT12(in_stack_fffffffffffffec2,
                                                CONCAT11(in_stack_fffffffffffffec1,
                                                         in_stack_fffffffffffffec0)))),
                     (char *)in_stack_fffffffffffffeb8,(char *)0x25c75e);
          str_00.m_data = in_RSI;
          str_00.m_size = (qsizetype)in_RDX;
          unquote(str_00);
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffffec4,
                                      CONCAT13(in_stack_fffffffffffffec3,
                                               CONCAT12(in_stack_fffffffffffffec2,
                                                        CONCAT11(in_stack_fffffffffffffec1,
                                                                 in_stack_fffffffffffffec0)))),
                             in_stack_fffffffffffffeb8);
          QString::~QString((QString *)0x25c7a2);
        }
        else {
          QByteArrayView::QByteArrayView<QByteArray,_true>(this,in_stack_fffffffffffffec8);
          bv_01.m_data._0_4_ = in_stack_fffffffffffffee8;
          bv_01.m_size = (qsizetype)__s;
          bv_01.m_data._4_4_ = in_stack_fffffffffffffeec;
          in_stack_fffffffffffffec1 = QByteArray::startsWith(in_stack_fffffffffffffec8,bv_01);
          if ((bool)in_stack_fffffffffffffec1) {
            QByteArray::size(in_RCX);
            QByteArrayView::QByteArrayView<char,_true>
                      ((QByteArrayView *)
                       CONCAT44(in_stack_fffffffffffffec4,
                                CONCAT13(in_stack_fffffffffffffec3,
                                         CONCAT12(in_stack_fffffffffffffec2,
                                                  CONCAT11(in_stack_fffffffffffffec1,
                                                           in_stack_fffffffffffffec0)))),
                       (char *)in_stack_fffffffffffffeb8,(char *)0x25c814);
            str_01.m_data = in_RSI;
            str_01.m_size = (qsizetype)in_RDX;
            unquote(str_01);
            QString::operator=((QString *)
                               CONCAT44(in_stack_fffffffffffffec4,
                                        CONCAT13(in_stack_fffffffffffffec3,
                                                 CONCAT12(in_stack_fffffffffffffec2,
                                                          CONCAT11(in_stack_fffffffffffffec1,
                                                                   in_stack_fffffffffffffec0)))),
                               in_stack_fffffffffffffeb8);
            QString::~QString((QString *)0x25c849);
          }
        }
      }
      __s = (char *)((long)&this->m_size + 1);
    }
    local_e1 = true;
    QByteArray::~QByteArray((QByteArray *)0x25c87a);
  }
  QByteArray::~QByteArray((QByteArray *)0x25c887);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_e1;
}

Assistant:

static bool readEtcFile(QUnixOSVersion &v, const char *filename,
                        const QByteArray &idKey, const QByteArray &versionKey, const QByteArray &prettyNameKey)
{

    QByteArray buffer = getEtcFileContent(filename);
    if (buffer.isEmpty())
        return false;

    const char *ptr = buffer.constData();
    const char *end = buffer.constEnd();
    const char *eol;
    QByteArray line;
    for (; ptr != end; ptr = eol + 1) {
        // find the end of the line after ptr
        eol = static_cast<const char *>(memchr(ptr, '\n', end - ptr));
        if (!eol)
            eol = end - 1;
        line.setRawData(ptr, eol - ptr);

        if (line.startsWith(idKey)) {
            ptr += idKey.size();
            v.productType = unquote({ptr, eol});
            continue;
        }

        if (line.startsWith(prettyNameKey)) {
            ptr += prettyNameKey.size();
            v.prettyName = unquote({ptr, eol});
            continue;
        }

        if (line.startsWith(versionKey)) {
            ptr += versionKey.size();
            v.productVersion = unquote({ptr, eol});
            continue;
        }
    }

    return true;
}